

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS_linux_common.cpp
# Opt level: O0

string * OS::trim(string *str)

{
  string *in_RSI;
  string *in_RDI;
  size_type end;
  size_type start;
  string whitespace;
  allocator local_59;
  long local_58;
  long local_50;
  allocator local_31;
  string local_30 [32];
  string *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30," \t",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_50 = std::__cxx11::string::find_first_not_of(local_10,(ulong)local_30);
  local_58 = std::__cxx11::string::find_last_not_of(local_10,(ulong)local_30);
  if ((local_50 == -1) || (local_58 == -1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_10);
  }
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

static std::string trim(const std::string& str)
{
    const std::string whitespace(" \t");
    const auto start = str.find_first_not_of(whitespace);
    const auto end = str.find_last_not_of(whitespace);

    if( start == std::string::npos || end == std::string::npos )
    {
        return "";
    }

    return str.substr(start, end - start + 1);
}